

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::AdapterPromiseNode<unsigned_long,_kj::WaiterQueue<unsigned_long>::Node>::destroy
          (AdapterPromiseNode<unsigned_long,_kj::WaiterQueue<unsigned_long>::Node> *this)

{
  WaiterQueue<unsigned_long>::Node::~Node(&this->adapter);
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  AsyncObject::~AsyncObject((AsyncObject *)&this->super_PromiseFulfiller<unsigned_long>);
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }